

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_calc.cpp
# Opt level: O2

int main(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
  *this;
  mapped_type *pp_Var1;
  mapped_type *pp_Var2;
  istream *piVar3;
  ostream *poVar4;
  double dVar5;
  string line;
  allocator local_291;
  storage_union local_290;
  long local_280;
  string local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270 [3];
  CalcReader reader;
  
  Omega_h::math_lang::ask_reader_tables();
  Omega_h::Reader::Reader(&reader.super_Reader,local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_270);
  this = &reader.unary_function_map;
  reader._0_8_ = &PTR__CalcReader_0010ac80;
  reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header;
  reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header;
  reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header;
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reader.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reader.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reader.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&line,"sqrt",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = sqrt;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"sin",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = sin;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"cos",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = cos;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"tan",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = tan;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"asin",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = asin;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"acos",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = acos;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"atan",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = atan;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"exp",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = exp;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"log",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = log;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"log10",(allocator *)&local_290);
  pp_Var1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[](this,&line);
  *pp_Var1 = log10;
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::string((string *)&line,"atan2",(allocator *)&local_290);
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double)>_>_>
            ::operator[](&reader.binary_function_map,&line);
  *pp_Var2 = atan2;
  std::__cxx11::string::~string((string *)&line);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string(local_278,"input",&local_291);
    Omega_h::Reader::read_string((string *)&local_290,(string *)&reader);
    dVar5 = Omega_h::any_cast<double>((any *)&local_290);
    poVar4 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar4,'\n');
    if (local_280 != 0) {
      (**(code **)(local_280 + 8))(&local_290);
      local_280 = 0;
    }
    std::__cxx11::string::~string(local_278);
  }
  std::__cxx11::string::~string((string *)&line);
  anon_unknown.dwarf_90be::CalcReader::~CalcReader(&reader);
  return 0;
}

Assistant:

int main() {
  CalcReader reader;
  for (std::string line; std::getline(std::cin, line);) {
    std::cout << Omega_h::any_cast<double>(reader.read_string("input", line))
              << '\n';
  }
}